

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat-types.h
# Opt level: O3

bool __thiscall SAT::locked(SAT *this,Clause *c)

{
  char cVar1;
  uint uVar2;
  char cVar3;
  uint uVar4;
  
  if (*(uint *)c < 0x100) {
    abort();
  }
  uVar2 = c->data[0].x;
  uVar4 = (int)uVar2 >> 1;
  if ((this->reason).data[uVar4].field_0._pt != c) {
    return false;
  }
  cVar1 = (this->assigns).data[uVar4];
  cVar3 = -cVar1;
  if ((uVar2 & 1) == 0) {
    cVar3 = cVar1;
  }
  return cVar3 == ::l_True.value;
}

Assistant:

Lit& operator[](int i) {
		if (i >= static_cast<int>(sz)) {
			abort();
		}
		return data[i];
	}